

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ClassEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  StandardChars<unsigned_char> *pSVar1;
  EncodedChar *pEVar2;
  CharCount n;
  EncodedChar EVar3;
  bool bVar4;
  byte bVar5;
  Char CVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  EVar3 = ECLookahead(this,0);
  if ((EVar3 == '\0') && (this->inputLim <= this->next)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  bVar4 = StandardChars<unsigned_char>::IsOctal(this->standardEncodedChars,EVar3);
  if (bVar4) {
    iVar11 = 3;
    uVar12 = 0;
    do {
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      uVar13 = uVar7 + uVar12 * 8;
      if (0xff < uVar13) break;
      ECConsume(this,1);
      iVar11 = iVar11 + -1;
      uVar12 = uVar13;
      if (iVar11 == 0) break;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      bVar4 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar3);
    } while (bVar4);
    CVar6 = Chars<char16_t>::UTC(uVar12 & 0xffff);
    *singleton = CVar6;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  }
  else {
    pEVar2 = this->tempLocationOfSurrogatePair;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    CVar6 = NextChar(this);
    bVar4 = false;
    switch(CVar6) {
    case L'b':
      *singleton = L'\b';
      break;
    case L'c':
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      bVar4 = StandardChars<unsigned_char>::IsLetter(pSVar1,EVar3);
      if (!bVar4) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
      }
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      bVar4 = StandardChars<unsigned_char>::IsWord(pSVar1,EVar3);
      if (bVar4) {
        bVar5 = ECLookahead(this,0);
        CVar6 = Chars<char16_t>::UTC((uint)(bVar5 & 0x1f));
        *singleton = CVar6;
        n = 1;
LAB_00d306a6:
        ECConsume(this,n);
      }
      else {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      break;
    case L'd':
    case L's':
    case L'w':
      goto switchD_00d30387_caseD_64;
    case L'f':
      *singleton = L'\f';
      break;
    case L'n':
      *singleton = L'\n';
      break;
    case L'r':
      *singleton = L'\r';
      break;
    case L't':
      *singleton = L'\t';
      break;
    case L'u':
      this->tempLocationOfSurrogatePair = pEVar2;
      iVar11 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar11) {
        return true;
      }
      if (this->next + 4 <= this->inputLim) {
        pSVar1 = this->standardEncodedChars;
        EVar3 = ECLookahead(this,0);
        bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
        if (bVar4) {
          pSVar1 = this->standardEncodedChars;
          EVar3 = ECLookahead(this,1);
          bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
          if (bVar4) {
            pSVar1 = this->standardEncodedChars;
            EVar3 = ECLookahead(this,2);
            bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
            if (bVar4) {
              pSVar1 = this->standardEncodedChars;
              EVar3 = ECLookahead(this,3);
              bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
              if (bVar4) {
                pSVar1 = this->standardEncodedChars;
                EVar3 = ECLookahead(this,0);
                uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
                pSVar1 = this->standardEncodedChars;
                EVar3 = ECLookahead(this,1);
                uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
                pSVar1 = this->standardEncodedChars;
                EVar3 = ECLookahead(this,2);
                uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
                pSVar1 = this->standardEncodedChars;
                EVar3 = ECLookahead(this,3);
                uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
                CVar6 = Chars<char16_t>::UTC(uVar9 << 4 | uVar10 | uVar7 << 0xc | uVar8 << 8);
                *singleton = CVar6;
                if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
                  TrackIfSurrogatePair(this,(uint)(ushort)CVar6,this->next + -1,5);
                }
                ECConsume(this,4);
                return true;
              }
            }
          }
        }
      }
      *singleton = L'u';
      return true;
    case L'v':
      *singleton = L'\v';
      break;
    case L'x':
      if (this->next + 2 <= this->inputLim) {
        pSVar1 = this->standardEncodedChars;
        EVar3 = ECLookahead(this,0);
        bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
        if (bVar4) {
          pSVar1 = this->standardEncodedChars;
          EVar3 = ECLookahead(this,1);
          bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
          if (bVar4) {
            pSVar1 = this->standardEncodedChars;
            EVar3 = ECLookahead(this,0);
            uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
            pSVar1 = this->standardEncodedChars;
            EVar3 = ECLookahead(this,1);
            uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
            CVar6 = Chars<char16_t>::UTC(uVar7 << 4 | uVar8);
            *singleton = CVar6;
            n = 2;
            goto LAB_00d306a6;
          }
        }
      }
      *singleton = L'x';
      break;
    default:
      if (CVar6 == L'D') {
        return false;
      }
      if (CVar6 == L'S') {
        return false;
      }
      if (CVar6 == L'W') {
        return false;
      }
    case L'e':
    case L'g':
    case L'h':
    case L'i':
    case L'j':
    case L'k':
    case L'l':
    case L'm':
    case L'o':
    case L'p':
    case L'q':
      *singleton = CVar6;
    }
  }
  bVar4 = true;
switchD_00d30387_caseD_64:
  return bVar4;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }